

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSizeAllocationsManager.hpp
# Opt level: O2

void __thiscall
Diligent::VariableSizeAllocationsManager::AddNewBlock
          (VariableSizeAllocationsManager *this,OffsetType Offset,OffsetType Size)

{
  iterator iVar1;
  char (*Args_1) [18];
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_bool>
  pVar2;
  string msg;
  OffsetType local_50;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
  local_48;
  char local_40;
  OffsetType local_38;
  string local_30;
  
  Args_1 = (char (*) [18])&local_50;
  local_50 = Size;
  local_38 = Offset;
  pVar2 = std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,std::_Select1st<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,Diligent::IMemoryAllocator>>
          ::_M_emplace_unique<unsigned_long&,unsigned_long&>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,std::_Select1st<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,Diligent::IMemoryAllocator>>
                      *)this,&local_38,(unsigned_long *)Args_1);
  local_48 = pVar2.first._M_node;
  local_40 = pVar2.second;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    FormatString<char[26],char[18]>
              (&local_30,(Diligent *)"Debug expression failed:\n",(char (*) [26])"NewBlockIt.second"
               ,Args_1);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"AddNewBlock",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x1b3);
    std::__cxx11::string::~string((string *)&local_30);
  }
  iVar1 = std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,std::_Select1st<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,Diligent::IMemoryAllocator>>
          ::
          _M_emplace_equal<unsigned_long&,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>&>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,std::_Select1st<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,Diligent::IMemoryAllocator>>
                      *)&this->m_FreeBlocksBySize,&local_50,&local_48);
  local_48._M_node[1]._M_left = iVar1._M_node;
  return;
}

Assistant:

void AddNewBlock(OffsetType Offset, OffsetType Size)
    {
        auto NewBlockIt = m_FreeBlocksByOffset.emplace(Offset, Size);
        VERIFY_EXPR(NewBlockIt.second);
        auto OrderIt                           = m_FreeBlocksBySize.emplace(Size, NewBlockIt.first);
        NewBlockIt.first->second.OrderBySizeIt = OrderIt;
    }